

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.cpp
# Opt level: O0

float vector_utils::sum(vector<float,_std::allocator<float>_> *a)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined4 local_18;
  undefined4 local_14;
  int i;
  float accumulator;
  vector<float,_std::allocator<float>_> *a_local;
  
  local_14 = 0.0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(a);
    if (sVar1 <= (ulong)(long)local_18) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](a,(long)local_18);
    local_14 = *pvVar2 + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

float vector_utils::sum(const std::vector<float>& a)
{
  float accumulator = 0.0f;

  for (auto i = 0; i < a.size(); ++i)
  {
    accumulator += a[i];
  }

  return accumulator;
}